

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.hpp
# Opt level: O1

void __thiscall
helics::EndpointInformation::EndpointInformation
          (EndpointInformation *this,GlobalHandle gid,string_view key_,string_view type_)

{
  this->id = gid;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_._M_str,key_._M_str + key_._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,type_._M_str,type_._M_str + type_._M_len);
  return;
}

Assistant:

EndpointInformation(GlobalHandle gid, std::string_view key_, std::string_view type_):
        id(gid), key(key_), type(type_)
    {
    }